

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O1

void adt_hnode_insert(adt_hnode_t *node,adt_hkey_t *key,uint32_t u32Hash)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  adt_hmatch_t *__ptr;
  adt_hkey_tag *paVar3;
  undefined8 uVar4;
  adt_hmatch_t *paVar5;
  adt_hkey_t *paVar6;
  byte bVar7;
  byte bVar8;
  adt_hkey_t **ppaVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  
  while( true ) {
    while( true ) {
      if (node == (adt_hnode_t *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                      ,0x14b,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
      }
      if (key == (adt_hkey_t *)0x0) {
        __assert_fail("key",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                      ,0x14c,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
      }
      bVar8 = node->u8Width;
      if (bVar8 != 0x10) break;
      node = (adt_hnode_t *)
             ((long)&((node->child).match)->u32Hash +
             (ulong)((u32Hash >> ((node->u8Depth & 7) << 2) & 0xf) << 4));
    }
    bVar7 = node->u8Cur;
    if (bVar7 != 0) {
      ppaVar9 = &((node->child).match)->key;
      bVar12 = bVar7;
      do {
        if (((adt_hmatch_t *)(ppaVar9 + -1))->u32Hash == u32Hash) {
          paVar3 = *ppaVar9;
          if (*ppaVar9 != (adt_hkey_t *)0x0) {
            do {
              paVar6 = paVar3;
              paVar3 = paVar6->next;
            } while (paVar3 != (adt_hkey_tag *)0x0);
            paVar6->next = key;
            return;
          }
          __assert_fail("hkey != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                        ,0x156,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
        }
        ppaVar9 = ppaVar9 + 2;
        bVar12 = bVar12 - 1;
      } while (bVar12 != 0);
    }
    __ptr = (node->child).match;
    if (bVar7 < bVar8) {
      __ptr[bVar7].key = key;
      node->u8Cur = bVar7 + 1;
      (node->child).match[bVar7].u32Hash = u32Hash;
      return;
    }
    bVar7 = bVar8 * '\x02';
    node->u8Width = bVar7;
    if (bVar7 < 0x10) {
      paVar5 = (adt_hmatch_t *)malloc((ulong)(byte)(bVar8 << 5));
      (node->child).match = paVar5;
      if (paVar5 != (adt_hmatch_t *)0x0) {
        if (node->u8Cur != '\0') {
          lVar10 = 0;
          uVar11 = 0;
          do {
            puVar1 = (undefined8 *)((long)&__ptr->u32Hash + lVar10);
            uVar4 = puVar1[1];
            puVar2 = (undefined8 *)((long)&((node->child).match)->u32Hash + lVar10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar4;
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x10;
          } while (uVar11 < node->u8Cur);
        }
        free(__ptr);
        bVar8 = node->u8Cur;
        (node->child).match[bVar8].key = key;
        node->u8Cur = bVar8 + 1;
        (node->child).match[bVar8].u32Hash = u32Hash;
        return;
      }
      __assert_fail("node->child.match",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,0x167,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
    }
    if (bVar7 != 0x10) {
      __assert_fail("node->u8Width==16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,0x172,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
    }
    paVar5 = (adt_hmatch_t *)malloc(0x100);
    (node->child).match = paVar5;
    if (paVar5 == (adt_hmatch_t *)0x0) {
      __assert_fail("node->child.node",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,0x174,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
    }
    lVar10 = 0;
    do {
      adt_hnode_create((adt_hnode_t *)((long)&((node->child).match)->u32Hash + lVar10));
      *(uint8_t *)((long)&((node->child).match)->u32Hash + lVar10 + 2) = node->u8Depth + '\x01';
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x100);
    if (8 < node->u8Depth) break;
    bVar8 = node->u8Depth << 2;
    if (node->u8Cur != '\0') {
      ppaVar9 = &__ptr->key;
      uVar11 = 0;
      do {
        adt_hnode_insert((adt_hnode_t *)
                         ((long)&((node->child).match)->u32Hash +
                         (ulong)((((adt_hmatch_t *)(ppaVar9 + -1))->u32Hash >> (bVar8 & 0x1f) & 0xf)
                                << 4)),*ppaVar9,((adt_hmatch_t *)(ppaVar9 + -1))->u32Hash);
        uVar11 = uVar11 + 1;
        ppaVar9 = ppaVar9 + 2;
      } while (uVar11 < node->u8Cur);
    }
    free(__ptr);
    node = (adt_hnode_t *)
           ((long)&((node->child).match)->u32Hash + (ulong)((u32Hash >> (bVar8 & 0x1f) & 0xf) << 4))
    ;
  }
  __assert_fail("node->u8Depth<=8",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                ,0x179,"void adt_hnode_insert(adt_hnode_t *, adt_hkey_t *, uint32_t)");
}

Assistant:

void adt_hnode_insert(adt_hnode_t *node, adt_hkey_t *key, uint32_t u32Hash){
	uint8_t i;
	assert(node);
	assert(key);
	if(node->u8Width == 16){
		uint32_t u32Bits = (node->u8Depth)*4;
		uint8_t u8Bucket = (uint8_t) ((u32Hash >> u32Bits) & 0xF);
		adt_hnode_insert(&node->child.node[u8Bucket],key,u32Hash);
	}
	else{
		for(i=0;i<node->u8Cur;i++){
			if(node->child.match[i].u32Hash == u32Hash){
				adt_hkey_t *hkey = node->child.match[i].key;
				assert(hkey != 0);
				while(hkey->next){
					hkey = hkey->next;
				}
				hkey->next = key;
				return;
			}
		}
		if(node->u8Cur < node->u8Width){
			node->child.match[node->u8Cur].key = key;
			node->child.match[node->u8Cur++].u32Hash = u32Hash;
		}
		else{
			adt_hmatch_t* old = node->child.match;
			node->u8Width *= 2;
			if(node->u8Width<16){
				node->child.match = (adt_hmatch_t*) malloc(sizeof(adt_hmatch_t)*node->u8Width);
				assert(node->child.match);
				for(i=0;i<node->u8Cur;i++){
					node->child.match[i]=old[i];
				}
				free(old);
				node->child.match[node->u8Cur].key = key;
				node->child.match[node->u8Cur++].u32Hash = u32Hash;
			}
			else{
            uint32_t u32Bits;
            uint8_t u8Bucket;
				assert(node->u8Width==16);
				node->child.node = (adt_hnode_t*) malloc(sizeof(adt_hnode_t)*16);
				assert(node->child.node);
				for(i=0;i<16;i++){
					adt_hnode_create(&node->child.node[i]);
					node->child.node[i].u8Depth = node->u8Depth+1;
				}
				assert(node->u8Depth<=8);
            u32Bits = (node->u8Depth)*4;
				for(i=0;i<node->u8Cur;i++){
					u8Bucket = (uint8_t) ( (old[i].u32Hash >> u32Bits) & 0xF);
					adt_hnode_insert(&node->child.node[u8Bucket],old[i].key,old[i].u32Hash);
				}
				free(old);
            u8Bucket = (uint8_t) ((u32Hash >> u32Bits) & 0xF);
				adt_hnode_insert(&node->child.node[u8Bucket],key,u32Hash);
			}
		}
	}
}